

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Proof::add_derived_clause
          (Proof *this,Clause *c,vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  pointer puVar1;
  unsigned_long *cid;
  pointer __x;
  
  add_literals(this,c);
  puVar1 = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != puVar1; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->proof_chain,__x);
  }
  this->clause_id = (uint64_t)c->field_0;
  this->redundant = (bool)((byte)(*(uint *)&c->field_0x8 >> 0xb) & 1);
  add_derived_clause(this);
  return;
}

Assistant:

void Proof::add_derived_clause (Clause *c, const vector<uint64_t> &chain) {
  LOG (c, "PROOF adding to proof derived");
  assert (clause.empty ());
  assert (proof_chain.empty ());
  add_literals (c);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = c->id;
  redundant = c->redundant;
  add_derived_clause ();
}